

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KuhnAlgorithm.cpp
# Opt level: O1

int16_t __thiscall BoxNesting::KuhnAlgorithm::runAlgorithm(KuhnAlgorithm *this)

{
  ulong *puVar1;
  bool bVar2;
  int16_t iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  ulong *__s;
  ulong uVar8;
  
  do {
    __s = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p;
    puVar1 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    uVar4 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
            ._M_finish.super__Bit_iterator_base._M_offset;
    if (__s != puVar1) {
      memset(__s,0,(long)puVar1 - (long)__s);
      __s = puVar1;
    }
    if (uVar4 != 0) {
      *__s = *__s & ~(0xffffffffffffffffU >> (-(char)uVar4 & 0x3fU));
    }
    uVar5 = (ulong)(ushort)this->leftVerticesCount;
    if (this->leftVerticesCount < 1) {
      bVar7 = 0;
    }
    else {
      uVar8 = 0;
      bVar7 = 0;
      do {
        if (((this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8] == -1) &&
           (((this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar8 >> 6] >>
             (uVar8 & 0x3f) & 1) == 0)) {
          bVar2 = kuhn(this,(int16_t)uVar8);
          bVar7 = bVar7 | bVar2;
        }
        uVar8 = uVar8 + 1;
        uVar5 = (ulong)this->leftVerticesCount;
      } while ((long)uVar8 < (long)uVar5);
    }
    iVar3 = (int16_t)uVar5;
  } while (bVar7 != 0);
  if (0 < (long)this->rightVerticesCount) {
    lVar6 = 0;
    do {
      uVar4 = (int)uVar5 -
              (uint)((this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar6] != -1);
      uVar5 = (ulong)uVar4;
      iVar3 = (int16_t)uVar4;
      lVar6 = lVar6 + 1;
    } while (this->rightVerticesCount != lVar6);
  }
  return iVar3;
}

Assistant:

int16_t KuhnAlgorithm::runAlgorithm() const
{
	bool pathFound;
	do {
		fill(this->used.begin(), this->used.end(), false);
		pathFound = false;
		// remember to start only from free vertices which are not visited yet
		for (int16_t i = 0; i < this->leftVerticesCount; ++i) {
			if (this->pairsLeft[i] == -1 && !this->used[i]) {
				pathFound |= kuhn(i);
			}
		}
	} while (pathFound);

	// We have the same amount of visible boxes as there
	// are vertices in the left part of the bipartite graph
	// for each valid match (i.e. a box can nest inside another box)
	// we remove a visible box
	int16_t visibleBoxes = this->leftVerticesCount;
	for (int16_t i = 0; i < this->rightVerticesCount; ++i) {
		if (this->pairsRight[i] != -1) {
			--visibleBoxes;
		}
	}

	return visibleBoxes;
}